

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O3

RowVector __thiscall
rek::Solver::solve(Solver *this,SparseMatrix<double,_1,_int> *A,Matrix<double,__1,_1,_0,__1,_1> *b,
                  long maxIterations,double tolerance)

{
  double *pdVar1;
  int *piVar2;
  Scalar_conflict *pSVar3;
  StorageIndex *pSVar4;
  Solver *pSVar5;
  Scalar SVar6;
  Scalar *pSVar7;
  long lVar8;
  Index extraout_RDX;
  long lVar9;
  Index size;
  long lVar10;
  long row;
  RowVector RVar11;
  SparseMatrix<double,_0,_int> AColMajor;
  scalar_sum_op<int,_int> local_e1;
  SparseMatrix<double,_1,_int> *local_e0;
  long local_d8;
  Solver *local_c8;
  double local_c0;
  SparseMatrix<double,_0,_int> *local_b8;
  Scalar local_b0;
  SparseMatrix<double,_0,_int> local_a8;
  Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_60;
  redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_48;
  
  local_a8.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_a8.m_outerSize = 0;
  local_a8.m_innerSize = 0;
  local_a8.m_outerIndex = (StorageIndex *)0x0;
  local_a8.m_innerNonZeros = (StorageIndex *)0x0;
  local_a8.m_data.m_values = (Scalar_conflict *)0x0;
  local_a8.m_data.m_indices = (StorageIndex *)0x0;
  local_a8.m_data.m_size = 0;
  local_a8.m_data.m_allocatedSize = 0;
  local_c0 = tolerance;
  Eigen::SparseMatrix<double,_0,_int>::resize
            (&local_a8,
             (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
             (Index)b[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data);
  pdVar1 = b[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 == (double *)0x0) {
    piVar2 = (int *)b[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows;
    size = (long)piVar2[(b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows] - (long)*piVar2;
  }
  else {
    lVar8 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (lVar8 == 0) {
      size = 0;
    }
    else {
      local_60.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = (PointerType)pdVar1;
      local_60.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = lVar8;
      if (lVar8 < 0) {
        __assert_fail("vecSize >= 0","/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xa6,
                      "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<int, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Matrix<int, -1, 1>>, Level = 0]"
                     );
      }
      local_48.
      super_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      .
      super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
      .m_data = (PointerType)pdVar1;
      local_48.
      super_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      .
      super_mapbase_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = lVar8;
      SVar6 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<int,int>,Eigen::internal::redux_evaluator<Eigen::Map<Eigen::Matrix<int,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>>,3,0>
              ::run<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                        (&local_48,&local_e1,&local_60);
      size = (Index)SVar6;
    }
  }
  if (local_a8.m_innerNonZeros == (StorageIndex *)0x0) {
    Eigen::internal::CompressedStorage<double,_int>::reserve(&local_a8.m_data,size);
    lVar8 = (b->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    local_e0 = A;
    local_d8 = maxIterations;
    local_c8 = this;
    if (0 < lVar8) {
      row = 0;
      local_b8 = (SparseMatrix<double,_0,_int> *)b;
      do {
        lVar10 = (long)((SparseMatrix<double,_0,_int> *)b)->m_outerIndex[row];
        if (((SparseMatrix<double,_0,_int> *)b)->m_innerNonZeros == (StorageIndex *)0x0) {
          lVar9 = (long)((SparseMatrix<double,_0,_int> *)b)->m_outerIndex[row + 1];
        }
        else {
          lVar9 = ((SparseMatrix<double,_0,_int> *)b)->m_innerNonZeros[row] + lVar10;
        }
        if (lVar10 < lVar9) {
          pSVar3 = (((SparseMatrix<double,_0,_int> *)b)->m_data).m_values;
          pSVar4 = (((SparseMatrix<double,_0,_int> *)b)->m_data).m_indices;
          do {
            local_b0 = pSVar3[lVar10];
            pSVar7 = Eigen::SparseMatrix<double,_0,_int>::insert(&local_a8,row,(long)pSVar4[lVar10])
            ;
            *pSVar7 = local_b0;
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
          lVar8 = local_b8->m_outerSize;
          b = (Matrix<double,__1,_1,_0,__1,_1> *)local_b8;
        }
        row = row + 1;
      } while (row < lVar8);
    }
    pSVar5 = local_c8;
    solve(local_c8,local_e0,(SparseMatrix<double,_0,_int> *)b,(RowVector *)&local_a8,local_d8,
          local_c0);
    free(local_a8.m_outerIndex);
    free(local_a8.m_innerNonZeros);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_a8.m_data);
    RVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    RVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)pSVar5;
    return (RowVector)
           RVar11.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("isCompressed() && \"This function does not make sense in non compressed mode.\"",
                "/usr/include/eigen3/Eigen/src/SparseCore/SparseMatrix.h",0x10a,
                "void Eigen::SparseMatrix<double>::reserve(Index) [_Scalar = double, _Options = 0, _StorageIndex = int]"
               );
}

Assistant:

RowVector solve(SparseMatrix<double, RowMajor> &A,
                  const Matrix<double, Dynamic, 1> &b, long maxIterations,
                  double tolerance = tolerance_) const {
    SparseMatrix<double, ColMajor> AColMajor(A.rows(), A.cols());

    // Copy row major to column major sparse matrix
    AColMajor.reserve(A.nonZeros());
    for (long k = 0; k < A.outerSize(); ++k)
      for (SparseMatrix<double, RowMajor>::InnerIterator it(A, k); it; ++it) {
        AColMajor.insert(it.row(), it.col()) = it.value();
      }

    return solve(A, AColMajor, b, maxIterations, tolerance);
  }